

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_drag(nk_text_edit *state,float x,float y,nk_user_font *font,float row_height)

{
  int iVar1;
  int p;
  float row_height_local;
  nk_user_font *font_local;
  float y_local;
  float x_local;
  nk_text_edit *state_local;
  
  iVar1 = nk_textedit_locate_coord(state,x,y,font,row_height);
  if (state->select_start == state->select_end) {
    state->select_start = state->cursor;
  }
  state->select_end = iVar1;
  state->cursor = iVar1;
  return;
}

Assistant:

NK_LIB void
nk_textedit_drag(struct nk_text_edit *state, float x, float y,
    const struct nk_user_font *font, float row_height)
{
    /* API drag: on mouse drag, move the cursor and selection endpoint
     * to the clicked location */
    int p = nk_textedit_locate_coord(state, x, y, font, row_height);
    if (state->select_start == state->select_end)
        state->select_start = state->cursor;
    state->cursor = state->select_end = p;
}